

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

void __thiscall Satyricon::SATSolver::reduce_learned(SATSolver *this)

{
  double dVar1;
  ClausePtr c;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  Clause *this_00;
  __normal_iterator<Satyricon::Clause_**,_std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>_>
  __i;
  pointer ppCVar7;
  ulong uVar8;
  size_type __new_size;
  undefined1 auVar9 [16];
  
  ppCVar6 = (this->learned).
            super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar5 = (this->learned).
            super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar3 = (long)ppCVar5 - (long)ppCVar6 >> 3;
  dVar1 = (this->param).clause_activity_update;
  auVar9._8_4_ = (int)((long)ppCVar5 - (long)ppCVar6 >> 0x23);
  auVar9._0_8_ = uVar3;
  auVar9._12_4_ = 0x45300000;
  if (ppCVar5 != ppCVar6) {
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
              (ppCVar6,ppCVar5,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppCVar5 - (long)ppCVar6 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
                (ppCVar6,ppCVar5);
    }
    else {
      ppCVar7 = ppCVar6 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
                (ppCVar6,ppCVar7);
      for (; ppCVar7 != ppCVar5; ppCVar7 = ppCVar7 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,__gnu_cxx::__ops::_Val_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
                  (ppCVar7);
      }
    }
  }
  __new_size = 0;
  uVar8 = 0;
  while( true ) {
    ppCVar5 = (this->learned).
              super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar6 = (this->learned).
              super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppCVar6 - (long)ppCVar5 >> 3) >> 1 <= uVar8) break;
    c = ppCVar5[uVar8];
    if ((((ulong)*c & 0xfffffffe) == 4) ||
       ((this->antecedents).
        super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
        super__Vector_impl_data._M_start[*(uint *)(c + 1) >> 1] == c)) {
      ppCVar5[__new_size] = c;
      __new_size = __new_size + 1;
    }
    else {
      remove_clause(this,c);
    }
    uVar8 = uVar8 + 1;
  }
  do {
    if ((ulong)((long)ppCVar6 - (long)ppCVar5 >> 3) <= uVar8) {
      std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::resize
                (&this->learned,__new_size);
      return;
    }
    this_00 = ppCVar5[uVar8];
    if ((((ulong)*this_00 & 0xfffffffe) == 4) ||
       ((this->antecedents).
        super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
        super__Vector_impl_data._M_start[*(uint *)(this_00 + 1) >> 1] == this_00)) {
LAB_001139ff:
      ppCVar5[__new_size] = this_00;
      __new_size = __new_size + 1;
    }
    else {
      pdVar4 = Clause::get_activity(this_00);
      ppCVar5 = (this->learned).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this_00 = ppCVar5[uVar8];
      if (dVar1 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) <= *pdVar4)
      goto LAB_001139ff;
      remove_clause(this,this_00);
    }
    uVar8 = uVar8 + 1;
    ppCVar5 = (this->learned).
              super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar6 = (this->learned).
              super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void SATSolver::reduce_learned() {
    size_t i = 0, j = 0; // use this indices to compact the vector
    // Remove any clause below this activity
    double  extra_lim = param.clause_activity_update / learned.size();

    // sort learned clause by activity (in ascending order)
    sort(learned.begin(), learned.end(),
            [&](const ClausePtr& l, const ClausePtr& r)
                { return l->get_activity() < r->get_activity(); });

    // remove the first half
    for ( ; i < learned.size()/2 ; ++i ) {
        // keep a clause if is the antecedent of an asignment
        if ( learned[i]->size() == 2 || 
                antecedents[learned[i]->at(0).var()] == learned[i] )
            learned[j++] = learned[i]; // keep the justification
        else
            remove_clause(learned[i]);
    }

    // move the second half in the first half (this effectively delete the
    // low activity clauses)
    for (; i < learned.size(); ++i) {
        // keep a clause if is the antecedent of an asignment
        if ( learned[i]->size() == 2 || 
                antecedents[learned[i]->at(0).var()] == learned[i] ||
                learned[i]->get_activity() >= extra_lim )
            learned[j++] = learned[i]; // keep the justification
        else
            remove_clause(learned[i]);
    }

    // keep only the most active clause
    learned.resize( j );
}